

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

pair<const_char_*,_unsigned_long> __thiscall
naive_trie::get_longest_prefix(naive_trie *this,char *key,size_t len,size_t offset)

{
  char cVar1;
  undefined1 uVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<const_char_*,_unsigned_long> pVar6;
  
  for (; (len != 0 && (offset != len)); offset = offset + 1) {
    cVar1 = key[offset];
    p_Var3 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var3->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(char)uVar2 < cVar1]) {
      uVar2 = (undefined1)p_Var5[1]._M_color;
      if (cVar1 <= (char)uVar2) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var3) && (p_Var5 = p_Var4, cVar1 < (char)p_Var4[1]._M_color)
       ) {
      p_Var5 = &p_Var3->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var3) break;
    this = (naive_trie *)&p_Var5[1]._M_parent;
  }
  pVar6.second = offset;
  pVar6.first = key;
  return pVar6;
}

Assistant:

std::pair<const char *, size_t> get_longest_prefix(const char * key, size_t len, size_t offset = 0) const {
        if (len == 0 || offset == len) {
            return std::make_pair(key, offset);
        }
        char c = key[offset];
        auto res = children.find(c);
        if (res != children.end()) {
            return res->second.get_longest_prefix(key, len, offset + 1);
        }

        return std::make_pair(key, offset);
    }